

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

int __thiscall MutableS2ShapeIndex::GetEdgeMaxLevel(MutableS2ShapeIndex *this,Edge *edge)

{
  int iVar1;
  FloatType FVar2;
  double local_18;
  double dStack_10;
  double local_8;
  
  local_8 = (edge->v0).c_[2] - (edge->v1).c_[2];
  local_18 = (edge->v0).c_[0] - (edge->v1).c_[0];
  dStack_10 = (edge->v0).c_[1] - (edge->v1).c_[1];
  FVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_18);
  iVar1 = S2::Metric<1>::GetLevelForMaxValue
                    ((Metric<1> *)&S2::kAvgEdge,
                     FVar2 * FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
  return iVar1;
}

Assistant:

int MutableS2ShapeIndex::GetEdgeMaxLevel(const S2Shape::Edge& edge) const {
  // Compute the maximum cell size for which this edge is considered "long".
  // The calculation does not need to be perfectly accurate, so we use Norm()
  // rather than Angle() for speed.
  double cell_size = ((edge.v0 - edge.v1).Norm() *
                      FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
  // Now return the first level encountered during subdivision where the
  // average cell size is at most "cell_size".
  return S2::kAvgEdge.GetLevelForMaxValue(cell_size);
}